

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderMultisampleInterpolationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::ShaderMultisampleInterpolationApiCase::iterate(ShaderMultisampleInterpolationApiCase *this)

{
  GLSLVersion GVar1;
  bool bVar2;
  int iVar3;
  TestLog *log_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  char *pcVar6;
  TestError *pTVar7;
  char *local_9d8;
  int local_848;
  float local_844;
  GLint fragmentInterpolationOffsetBits;
  GLfloat maxFragmentInterpolationOffset;
  GLfloat minFragmentInterpolationOffset;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  string local_750;
  string local_730;
  allocator<char> local_70a;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  string local_620;
  string local_600;
  ProgramSources local_5e0;
  undefined1 local_510 [8];
  ShaderProgram program_1;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  string local_350;
  string local_330;
  allocator<char> local_30a;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_231;
  string local_230;
  string local_210;
  string local_1f0;
  ProgramSources local_1d0;
  undefined1 local_100 [8];
  ShaderProgram program;
  bool isOk;
  Functions *gl;
  TestLog *log;
  ShaderMultisampleInterpolationApiCase *this_local;
  long lVar5;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  program.m_program.m_info.linkTimeUs._7_1_ = 1;
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (this_00,"GL_OES_shader_multisample_interpolation");
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_NOT_SUPPORTED,"GL_OES_shader_multisample_interpolation");
      return STOP;
    }
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar6 = iterate::vss;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,pcVar6,&local_231);
  GVar1 = this->m_glslVersion;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"",&local_309);
  specializeVersion(&local_210,&local_230,GVar1,&local_268,&local_290,&local_2b8,&local_2e0,
                    &local_308);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar6,&local_30a);
  pcVar6 = iterate::fss;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar6,&local_371);
  GVar1 = this->m_glslVersion;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"",&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"",
             (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
  specializeVersion(&local_350,&local_370,GVar1,&local_398,&local_3c0,&local_3e8,&local_410,
                    &local_438);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,pcVar6,
             (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 6));
  glu::makeVtxFragSources(&local_1d0,&local_1f0,&local_330);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar4,&local_1d0);
  glu::ProgramSources::~ProgramSources(&local_1d0);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 6));
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_30a);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  glu::operator<<(log_00,(ShaderProgram *)local_100);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_100);
  if (bVar2) {
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    pcVar6 = iterate::vss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,pcVar6,&local_641);
    GVar1 = this->m_glslVersion;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"",&local_669);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"",&local_691);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_6b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"",&local_6e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"",&local_709);
    specializeVersion(&local_620,&local_640,GVar1,&local_668,&local_690,&local_6b8,&local_6e0,
                      &local_708);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,pcVar6,&local_70a);
    pcVar6 = iterate()::fss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,pcVar6,&local_771);
    GVar1 = this->m_glslVersion;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"",&local_799);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"",&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"",&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"",&local_811);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFragmentInterpolationOffset,"",
               (allocator<char> *)((long)&maxFragmentInterpolationOffset + 3));
    specializeVersion(&local_750,&local_770,GVar1,&local_798,&local_7c0,&local_7e8,&local_810,
                      (string *)&minFragmentInterpolationOffset);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_730,pcVar6,
               (allocator<char> *)((long)&maxFragmentInterpolationOffset + 2));
    glu::makeVtxFragSources(&local_5e0,&local_600,&local_730);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_510,pRVar4,&local_5e0);
    glu::ProgramSources::~ProgramSources(&local_5e0);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)((long)&maxFragmentInterpolationOffset + 2))
    ;
    std::__cxx11::string::~string((string *)&local_750);
    std::__cxx11::string::~string((string *)&minFragmentInterpolationOffset);
    std::allocator<char>::~allocator((allocator<char> *)((long)&maxFragmentInterpolationOffset + 3))
    ;
    std::__cxx11::string::~string((string *)&local_810);
    std::allocator<char>::~allocator(&local_811);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator(&local_7e9);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
    std::__cxx11::string::~string((string *)&local_770);
    std::allocator<char>::~allocator(&local_771);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_70a);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator(&local_6e1);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator(&local_6b9);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator(&local_669);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator(&local_641);
    glu::operator<<(log_00,(ShaderProgram *)local_510);
    bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_510);
    if (bVar2) {
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_510);
      fragmentInterpolationOffsetBits = 0;
      (**(code **)(lVar5 + 0x818))(0x8e5b,&fragmentInterpolationOffsetBits);
      if (-0.5 < (float)fragmentInterpolationOffsetBits) {
        program.m_program.m_info.linkTimeUs._7_1_ = 0;
      }
      local_844 = 0.0;
      (**(code **)(lVar5 + 0x818))(0x8e5c,&local_844);
      if (local_844 < 0.5) {
        program.m_program.m_info.linkTimeUs._7_1_ = 0;
      }
      local_848 = 0;
      (**(code **)(lVar5 + 0x868))(0x8e5d,&local_848);
      if (local_848 < 4) {
        program.m_program.m_info.linkTimeUs._7_1_ = 0;
      }
      if ((program.m_program.m_info.linkTimeUs._7_1_ & 1) == 0) {
        local_9d8 = "Fail";
      }
      else {
        local_9d8 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)((program.m_program.m_info.linkTimeUs._7_1_ & 1) == 0),local_9d8);
      return STOP;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderMultisampleInterpolationTests.cpp"
               ,0xb6);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderMultisampleInterpolationTests.cpp"
             ,0xa1);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ShaderMultisampleInterpolationApiCase::IterateResult ShaderMultisampleInterpolationApiCase::iterate()
{
	TestLog&			  log  = m_testCtx.getLog();
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_shader_multisample_interpolation");
		return STOP;
	}

	static char const* vss = "${VERSION_DECL}\n"
							 "${OES_SMI_RQ}"
							 "in highp vec4 a_position;\n"
							 "in highp vec4 a_color;\n"
							 "sample out highp vec4 v_color;\n"
							 "void main()\n"
							 "{\n"
							 "    gl_Position = a_position;\n"
							 "}\n";

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SMI_RQ}"
								 "sample in highp vec4 v_color;\n"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "    o_color = v_color;\n"
								 "}\n";

		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
														   specializeVersion(fss, m_glslVersion).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SMI_EN}"
								 "sample in highp vec4 v_color;\n"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "${OES_SMI_CH}"
								 "    o_color = v_color;\n"
								 "}\n";

		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
														   specializeVersion(fss, m_glslVersion).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	GLfloat minFragmentInterpolationOffset = 0.0f;
	gl.getFloatv(GL_MIN_FRAGMENT_INTERPOLATION_OFFSET, &minFragmentInterpolationOffset);
	if (minFragmentInterpolationOffset > -0.5f)
	{
		isOk = false;
	}

	GLfloat maxFragmentInterpolationOffset = 0.0f;
	gl.getFloatv(GL_MAX_FRAGMENT_INTERPOLATION_OFFSET, &maxFragmentInterpolationOffset);
	if (maxFragmentInterpolationOffset < 0.5f)
	{
		isOk = false;
	}

	GLint fragmentInterpolationOffsetBits = 0;
	gl.getIntegerv(GL_FRAGMENT_INTERPOLATION_OFFSET_BITS, &fragmentInterpolationOffsetBits);
	if (fragmentInterpolationOffsetBits < 4)
	{
		isOk = false;
	}

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}